

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
 __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::getUwa
          (TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,TypedTermList t,
          UnificationWithAbstraction uwa,bool fixedPointIteration)

{
  AbstractingUnifier *in_RCX;
  undefined8 in_RDX;
  IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
  *in_RDI;
  UnificationWithAbstraction in_R8D;
  uint uVar1;
  byte in_R9B;
  TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *unaff_retaddr;
  AbstractionOracle in_stack_0000000c;
  TypedTermList in_stack_00000010;
  AbstractionOracle in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff54;
  IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>_>
  *in_stack_ffffffffffffff78;
  AbstractionOracle local_80;
  AbstractionOracle local_7c [21];
  byte local_25;
  UnificationWithAbstraction local_24;
  undefined1 args_2;
  IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
  *pIVar2;
  undefined1 retrieveSubstitutions;
  
  args_2 = (undefined1)((ulong)in_RDX >> 0x38);
  local_25 = in_R9B & 1;
  local_24 = in_R8D;
  pIVar2 = in_RDI;
  Kernel::AbstractionOracle::AbstractionOracle(local_7c,in_R8D);
  retrieveSubstitutions = (undefined1)((ulong)pIVar2 >> 0x38);
  Kernel::AbstractingUnifier::empty(in_stack_ffffffffffffff4c);
  Kernel::AbstractionOracle::AbstractionOracle(&local_80,local_24);
  uVar1 = local_25 & 1;
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
            (unaff_retaddr,in_stack_00000010,(bool)retrieveSubstitutions,in_RCX,in_stack_0000000c,
             (bool)args_2);
  Lib::
  pvi<Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::Demodulation::Lhs>>>>
            (in_stack_ffffffffffffff78);
  Lib::
  IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>_>
  ::~IterTraits((IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>_>
                 *)0x370548);
  Kernel::AbstractingUnifier::~AbstractingUnifier
            ((AbstractingUnifier *)CONCAT44(in_stack_ffffffffffffff54,uVar1));
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
          )in_RDI;
}

Assistant:

VirtualIterator<QueryRes<AbstractingUnifier*, LeafData>> getUwa(TypedTermList t, Options::UnificationWithAbstraction uwa, bool fixedPointIteration) final override
  { return pvi(getResultIterator<typename SubstitutionTree::template Iterator<RetrievalAlgorithms::UnificationWithAbstraction<AbstractingUnifier, RetrievalAlgorithms::DefaultVarBanks>>>(t, /* retrieveSubstitutions */ true, AbstractingUnifier::empty(AbstractionOracle(uwa)), AbstractionOracle(uwa), fixedPointIteration)); }